

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedParamAssignmentSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax **args_3,
          Token *args_4)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  NamedParamAssignmentSyntax *pNVar22;
  
  pNVar22 = (NamedParamAssignmentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedParamAssignmentSyntax *)this->endPtr < pNVar22 + 1) {
    pNVar22 = (NamedParamAssignmentSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pNVar22 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar2 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar4 = args_2->info;
  pEVar1 = *args_3;
  TVar18 = args_4->kind;
  uVar19 = args_4->field_0x2;
  NVar20.raw = (args_4->numFlags).raw;
  uVar21 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pNVar22->super_ParamAssignmentSyntax).super_SyntaxNode.kind = NamedParamAssignment;
  (pNVar22->super_ParamAssignmentSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar22->super_ParamAssignmentSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pNVar22->dot).kind = TVar6;
  (pNVar22->dot).field_0x2 = uVar7;
  (pNVar22->dot).numFlags = (NumericTokenFlags)NVar8.raw;
  (pNVar22->dot).rawLen = uVar9;
  (pNVar22->dot).info = pIVar2;
  (pNVar22->name).kind = TVar10;
  (pNVar22->name).field_0x2 = uVar11;
  (pNVar22->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (pNVar22->name).rawLen = uVar13;
  (pNVar22->name).info = pIVar3;
  (pNVar22->openParen).kind = TVar14;
  (pNVar22->openParen).field_0x2 = uVar15;
  (pNVar22->openParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (pNVar22->openParen).rawLen = uVar17;
  (pNVar22->openParen).info = pIVar4;
  pNVar22->expr = pEVar1;
  (pNVar22->closeParen).kind = TVar18;
  (pNVar22->closeParen).field_0x2 = uVar19;
  (pNVar22->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (pNVar22->closeParen).rawLen = uVar21;
  (pNVar22->closeParen).info = pIVar5;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pNVar22;
  }
  return pNVar22;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }